

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

string * __thiscall
Assimp::parseUTF16String_abi_cxx11_
          (string *__return_storage_ptr__,Assimp *this,uint8_t *data,size_t len)

{
  DeadlyImportError *this_00;
  ulong uVar1;
  short v;
  vector<short,_std::allocator<short>_> utf16;
  ushort local_4a;
  vector<short,_std::allocator<short>_> local_48;
  
  if (((ulong)data & 1) == 0) {
    local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_start = (short *)0x0;
    local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_finish = (short *)0x0;
    local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (short *)0x0;
    std::vector<short,_std::allocator<short>_>::reserve(&local_48,(ulong)data >> 1);
    if (data != (uint8_t *)0x0) {
      uVar1 = 0;
      do {
        local_4a = *(ushort *)(this + uVar1 * 2) << 8 | *(ushort *)(this + uVar1 * 2) >> 8;
        if (local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<short,std::allocator<short>>::_M_realloc_insert<short_const&>
                    ((vector<short,std::allocator<short>> *)&local_48,
                     (iterator)
                     local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_finish,(short *)&local_4a);
        }
        else {
          *local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_finish = local_4a;
          local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data
          ._M_finish = local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
        }
        uVar1 = uVar1 + 1;
      } while ((ulong)data >> 1 != uVar1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    utf8::
    utf16to8<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,std::back_insert_iterator<std::__cxx11::string>>
              ((__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
               local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
               local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__return_storage_ptr__);
    if (local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
        _M_start != (short *)0x0) {
      operator_delete(local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  DeadlyImportError::DeadlyImportError(this_00,(string *)&parseErrorMessage_abi_cxx11_);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static std::string parseUTF16String(const uint8_t *data, size_t len) {
    if (len & 1) {
        throw DeadlyImportError(parseErrorMessage);
    }
    size_t numShorts = len / 2;
    std::vector<short> utf16;
    utf16.reserve(numShorts);
    for (size_t i = 0; i < numShorts; ++i) {
        short v = (data[0] << 8) | data[1];
        utf16.push_back(v);
        data += 2;
    }
    std::string result;
    utf8::utf16to8(utf16.begin(), utf16.end(), back_inserter(result));
    return result;
}